

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_importance.cc
# Opt level: O0

int main(void)

{
  _Setprecision _Var1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  double f_d;
  vec3 d;
  double dStack_18;
  int i;
  double sum;
  int N;
  
  dStack_18 = 0.0;
  for (d.e[2]._4_4_ = 0; d.e[2]._4_4_ < 1000000; d.e[2]._4_4_ = d.e[2]._4_4_ + 1) {
    random_unit_vector();
    dVar3 = f((vec3 *)&f_d);
    dVar4 = pdf((vec3 *)&f_d);
    dStack_18 = dVar3 / dVar4 + dStack_18;
  }
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
  _Var1 = std::setprecision(0xc);
  std::operator<<(poVar2,_Var1);
  poVar2 = std::operator<<((ostream *)&std::cout,"I = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dStack_18 / 1000000.0);
  std::operator<<(poVar2,'\n');
  return 0;
}

Assistant:

int main() {
    int N = 1000000;
    auto sum = 0.0;
    for (int i = 0; i < N; i++) {
        vec3 d = random_unit_vector();
        auto f_d = f(d);
        sum += f_d / pdf(d);
    }
    std::cout << std::fixed << std::setprecision(12);
    std::cout << "I = " << sum / N << '\n';
}